

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gemm_x86_fma.cpp
# Opt level: O0

int ncnn::gemm_AT_BT_x86_int8
              (Mat *AT,Mat *A_int8_scales,Mat *BT,float B_int8_scale,Mat *C,Mat *top_blob,
              int broadcast_type_C,int M,int N,int K,int output_transpose,float alpha,float beta,
              int constant_TILE_M,int constant_TILE_N,int constant_TILE_K,int nT,Option *opt)

{
  int *piVar1;
  long *in_RDX;
  long *in_RSI;
  long *in_RDI;
  undefined4 in_R9D;
  float in_XMM0_Da;
  undefined4 in_XMM1_Da;
  undefined4 in_XMM2_Da;
  int in_stack_00000008;
  int in_stack_00000010;
  int in_stack_00000018;
  undefined4 in_stack_00000020;
  undefined4 in_stack_00000040;
  long in_stack_00000048;
  Mat BT_tile;
  Mat AT_tile;
  int max_kk;
  Mat *in_stack_00000248;
  int k;
  int max_jj;
  int j;
  Mat topT_tile;
  int max_ii;
  int i_1;
  float beta_1;
  float alpha_1;
  int output_transpose_1;
  int broadcast_type_C_1;
  int TILE_K_1;
  int TILE_N_1;
  int TILE_M_1;
  int ppi;
  gemm_x86_int8_omp_args args;
  Mat topT;
  int i;
  Mat output_descales;
  int nn_M;
  int TILE_K;
  int TILE_N;
  int TILE_M;
  Mat *m;
  Mat *m_2;
  Mat *m_1;
  int in_stack_000022d0;
  int in_stack_000022d8;
  int in_stack_000022e0;
  Allocator *_allocator;
  float in_stack_fffffffffffff7c4;
  float in_stack_fffffffffffff7c8;
  int in_stack_fffffffffffff7cc;
  int in_stack_fffffffffffff7d0;
  int in_stack_fffffffffffff7d4;
  Mat *in_stack_fffffffffffff7d8;
  void **ppvVar2;
  Mat *in_stack_fffffffffffff7e0;
  Mat *in_stack_fffffffffffff7e8;
  int in_stack_fffffffffffff800;
  int in_stack_fffffffffffff808;
  Mat *in_stack_fffffffffffff810;
  void **in_stack_fffffffffffff818;
  undefined8 in_stack_fffffffffffff820;
  undefined8 in_stack_fffffffffffff828;
  undefined8 in_stack_fffffffffffff830;
  int *in_stack_fffffffffffff840;
  int *in_stack_fffffffffffff848;
  int *in_stack_fffffffffffff850;
  int in_stack_fffffffffffff858;
  undefined8 local_730;
  undefined8 local_728;
  undefined8 local_720;
  undefined4 local_718;
  long *local_710;
  undefined4 local_708;
  undefined4 local_704;
  undefined4 local_700;
  undefined4 local_6fc;
  undefined4 local_6f8;
  undefined8 local_6f0;
  void *local_6e8;
  int *local_6e0;
  long local_6d8;
  undefined4 local_6d0;
  long *local_6c8;
  undefined4 local_6c0;
  int local_6bc;
  undefined4 local_6b8;
  undefined4 local_6b4;
  undefined4 local_6b0;
  long local_6a8;
  undefined8 local_6a0;
  undefined8 local_698;
  undefined8 local_690;
  undefined4 local_688;
  Allocator *local_680;
  undefined4 local_678;
  undefined4 local_674;
  undefined4 local_670;
  undefined4 local_66c;
  undefined4 local_668;
  undefined8 local_660;
  Mat local_658;
  int local_610;
  int local_60c;
  int local_608;
  int local_604;
  int local_600;
  int local_5fc;
  void *local_5f8;
  int *local_5f0;
  ulong local_5e8;
  undefined4 local_5e0;
  long *local_5d8;
  int local_5d0;
  int local_5cc;
  int local_5c8;
  undefined4 local_5c4;
  undefined4 local_5c0;
  ulong local_5b8;
  int local_5ac;
  int local_5a8;
  int local_5a4;
  undefined4 local_5a0;
  undefined4 local_59c;
  undefined4 local_598;
  undefined4 local_594;
  int local_590;
  int local_58c;
  int local_588;
  int local_584;
  int local_580;
  int local_57c;
  int local_578;
  undefined4 local_574;
  undefined4 local_570;
  undefined4 local_56c;
  undefined4 local_568;
  undefined4 local_564;
  void *local_560;
  int *local_558;
  ulong local_550;
  undefined4 local_548;
  long *local_540;
  int local_538;
  int local_534;
  int local_530;
  undefined4 local_52c;
  int local_528;
  long local_520;
  int local_514;
  undefined4 local_510;
  void *local_500;
  int *local_4f8;
  undefined8 local_4f0;
  undefined4 local_4e8;
  long *local_4e0;
  undefined4 local_4d8;
  undefined4 local_4d4;
  undefined4 local_4d0;
  undefined4 local_4cc;
  int local_4c8;
  long local_4c0;
  int local_4b4;
  Allocator local_4b0;
  int local_4a8;
  undefined4 local_4a4;
  undefined4 local_4a0;
  undefined4 local_49c;
  float local_484;
  long *local_480;
  long *local_478;
  long *local_470;
  int local_464;
  undefined8 *local_460;
  undefined8 *local_450;
  void **local_440;
  Mat *local_430;
  void **local_420;
  void **local_410;
  void **local_400;
  void **local_3f0;
  void **local_3e8;
  undefined1 local_3dd;
  int local_3dc;
  void **local_3d8;
  void **local_3d0;
  int local_3a0;
  undefined4 local_39c;
  void **local_398;
  int local_380;
  undefined4 local_37c;
  void **local_378;
  int local_360;
  undefined4 local_35c;
  void **local_358;
  int local_340;
  undefined4 local_33c;
  Mat *local_338;
  int local_320;
  undefined4 local_31c;
  void **local_318;
  undefined8 *local_2f8;
  undefined8 *local_2d8;
  void **local_2d0;
  void **local_2c8;
  long local_2c0;
  void **local_2b8;
  long *local_2b0;
  undefined4 local_2a4;
  ulong local_2a0;
  void *local_298;
  undefined4 local_28c;
  int local_288;
  int local_284;
  void **local_280;
  undefined4 local_274;
  long local_270;
  void *local_248;
  void *local_238;
  void *local_228;
  void *local_218;
  void *local_208;
  undefined1 local_1ed;
  int local_1ec;
  undefined8 *local_1e0;
  long *local_1c0;
  undefined4 local_1b4;
  long local_1b0;
  long local_1a8;
  undefined4 local_19c;
  int local_198;
  int local_194;
  undefined8 *local_190;
  undefined4 local_184;
  long local_180;
  undefined1 local_16d;
  int local_16c;
  undefined8 *local_160;
  Allocator *local_140;
  int local_134;
  size_t local_130;
  long local_128;
  undefined4 local_11c;
  int local_118;
  int local_114;
  undefined8 *local_110;
  undefined4 local_104;
  long local_100;
  undefined4 local_f0;
  int local_ec;
  undefined8 *local_e8;
  void **local_e0;
  long *local_d8;
  undefined4 local_cc;
  long local_c8;
  void *local_c0;
  undefined4 local_b8;
  int local_b4;
  void **local_b0;
  undefined4 local_a8;
  int local_a4;
  undefined8 *local_a0;
  Mat *local_98;
  Allocator *local_90;
  int local_84;
  size_t local_80;
  void *local_78;
  undefined4 local_70;
  int local_6c;
  Mat *local_68;
  undefined8 local_60;
  undefined8 local_58;
  undefined4 local_48;
  int local_44;
  void **local_40;
  undefined8 local_38;
  undefined8 local_30;
  void **local_20;
  long local_18;
  
  _allocator = &local_4b0;
  local_4a4 = in_XMM2_Da;
  local_4a0 = in_XMM1_Da;
  local_49c = in_R9D;
  local_484 = in_XMM0_Da;
  local_480 = in_RDX;
  local_478 = in_RSI;
  local_470 = in_RDI;
  get_optimal_tile_mnk_int8
            ((int)((ulong)in_stack_fffffffffffff830 >> 0x20),(int)in_stack_fffffffffffff830,
             (int)((ulong)in_stack_fffffffffffff828 >> 0x20),(int)in_stack_fffffffffffff828,
             (int)((ulong)in_stack_fffffffffffff820 >> 0x20),(int)in_stack_fffffffffffff820,
             in_stack_fffffffffffff840,in_stack_fffffffffffff848,in_stack_fffffffffffff850,
             in_stack_fffffffffffff858);
  local_4b4 = (in_stack_00000008 + local_4a8 + -1) / local_4a8;
  local_38 = *(undefined8 *)(in_stack_00000048 + 0x10);
  local_20 = &local_500;
  local_30 = 4;
  local_500 = (void *)0x0;
  local_4f8 = (int *)0x0;
  local_4f0 = 0;
  local_4e8 = 0;
  local_4e0 = (long *)0x0;
  local_4d8 = 0;
  local_4d4 = 0;
  local_4d0 = 0;
  local_4cc = 0;
  local_4c8 = 0;
  local_4c0 = 0;
  Mat::create((Mat *)CONCAT44(in_stack_fffffffffffff7d4,in_stack_fffffffffffff7d0),
              in_stack_fffffffffffff7cc,CONCAT44(in_stack_fffffffffffff7c4,in_stack_00000040),
              _allocator);
  local_3e8 = &local_500;
  if (local_500 != (void *)0x0) {
    local_2d0 = local_3e8;
  }
  if (local_500 != (void *)0x0 && local_4c0 * local_4c8 != 0) {
    for (local_514 = 0; local_514 < in_stack_00000008; local_514 = local_514 + 1) {
      local_18 = (long)local_514;
      local_2c0 = (long)local_514;
      local_2b8 = &local_500;
      *(float *)((long)local_500 + local_2c0 * 4) =
           1.0 / (*(float *)(*local_478 + local_18 * 4) * local_484);
    }
    local_44 = local_4b0._vptr_Allocator._4_4_ * local_4a8;
    local_60 = *(undefined8 *)(in_stack_00000048 + 0x10);
    local_40 = &local_560;
    local_48 = 1;
    local_58 = 4;
    local_560 = (void *)0x0;
    local_558 = (int *)0x0;
    local_550 = 0;
    local_548 = 0;
    local_540 = (long *)0x0;
    local_538 = 0;
    local_534 = 0;
    local_530 = 0;
    local_52c = 0;
    local_528 = 0;
    local_520 = 0;
    Mat::create(in_stack_fffffffffffff7e0,(int)((ulong)in_stack_fffffffffffff7d8 >> 0x20),
                (int)in_stack_fffffffffffff7d8,in_stack_fffffffffffff7d4,
                CONCAT44(in_stack_fffffffffffff7cc,in_stack_fffffffffffff7c8),
                (Allocator *)CONCAT44(in_stack_fffffffffffff7c4,in_stack_00000040));
    local_3f0 = &local_560;
    if (local_560 != (void *)0x0) {
      local_2c8 = local_3f0;
    }
    if (local_560 != (void *)0x0 && local_520 * local_528 != 0) {
      local_580 = local_4a8;
      local_57c = local_4b0._vptr_Allocator._4_4_;
      local_578 = (int)local_4b0._vptr_Allocator;
      local_574 = local_49c;
      local_570 = 0;
      local_56c = in_stack_00000020;
      local_568 = local_4a0;
      local_564 = local_4a4;
      for (local_584 = 0; local_584 < local_4b4; local_584 = local_584 + 1) {
        local_588 = local_580;
        local_58c = local_57c;
        local_590 = local_578;
        local_594 = local_574;
        local_598 = local_56c;
        local_59c = local_568;
        local_5a0 = local_564;
        local_5a4 = local_584 * local_580;
        local_5ac = in_stack_00000008 - local_5a4;
        piVar1 = std::min<int>(&local_5ac,&local_588);
        local_5a8 = *piVar1;
        local_3dc = get_omp_thread_num();
        local_3d0 = &local_5f8;
        local_3d8 = &local_560;
        local_298 = (void *)((long)local_560 + local_520 * local_3dc * local_550);
        local_280 = &local_5f8;
        local_5f0 = (int *)0x0;
        local_5e8 = local_550;
        local_5e0 = local_548;
        local_5d8 = local_540;
        local_5cc = local_534;
        local_5c8 = local_530;
        local_5c4 = 1;
        local_5c0 = local_52c;
        local_270 = (long)local_534 * (long)local_530 * local_550;
        local_5b8 = (local_270 + 0xfU & 0xfffffffffffffff0) / local_550;
        local_5d0 = local_538 + -1;
        if (local_538 == 4) {
          local_5b8 = (long)local_534 * (long)local_530;
        }
        local_274 = 0x10;
        local_284 = local_534;
        local_288 = local_530;
        local_28c = local_52c;
        local_2a0 = local_550;
        local_2a4 = local_548;
        local_2b0 = local_540;
        local_3dd = 1;
        local_5f8 = local_298;
        for (local_5fc = 0; local_5fc < in_stack_00000010; local_5fc = local_58c + local_5fc) {
          local_604 = in_stack_00000010 - local_5fc;
          piVar1 = std::min<int>(&local_604,&local_58c);
          local_600 = *piVar1;
          for (local_608 = 0; local_608 < in_stack_00000018; local_608 = local_590 + local_608) {
            local_610 = in_stack_00000018 - local_608;
            piVar1 = std::min<int>(&local_610,&local_590);
            local_60c = *piVar1;
            local_16c = local_5a4 / local_588;
            local_160 = &local_6a0;
            local_114 = *(int *)((long)local_470 + 0x2c);
            local_118 = (int)local_470[6];
            local_11c = *(undefined4 *)((long)local_470 + 0x34);
            local_128 = *local_470 + local_470[8] * (long)local_16c * local_470[2];
            local_130 = local_470[2];
            local_134 = (int)local_470[3];
            local_140 = (Allocator *)local_470[4];
            local_110 = &local_6a0;
            local_100 = (long)local_114 * (long)local_118 * local_130;
            local_a4 = local_608 / local_590;
            local_98 = &local_658;
            local_a0 = &local_6a0;
            local_78 = (void *)(local_128 + (long)local_114 * (long)local_a4 * local_130);
            local_68 = &local_658;
            local_658.cstep = (size_t)local_114;
            local_460 = &local_6a0;
            local_1ec = local_5fc / local_58c;
            local_1e0 = &local_730;
            local_194 = *(int *)((long)local_480 + 0x2c);
            local_198 = (int)local_480[6];
            local_19c = *(undefined4 *)((long)local_480 + 0x34);
            local_1a8 = *local_480 + local_480[8] * (long)local_1ec * local_480[2];
            local_1b0 = local_480[2];
            local_1b4 = (undefined4)local_480[3];
            local_1c0 = (long *)local_480[4];
            local_190 = &local_730;
            local_180 = (long)local_194 * (long)local_198 * local_1b0;
            local_ec = local_608 / local_590;
            local_e0 = &local_6e8;
            local_e8 = &local_730;
            local_c0 = (void *)(local_1a8 + (long)local_194 * (long)local_ec * local_1b0);
            local_b0 = &local_6e8;
            local_6a8 = (long)local_194;
            local_450 = &local_730;
            local_658.c = 1;
            local_658.d = 1;
            local_658.h = 1;
            local_658.dims = 2;
            local_658.refcount = (int *)0x0;
            local_668 = 0;
            local_66c = 0;
            local_670 = 0;
            local_674 = 0;
            local_688 = 0;
            local_690 = 0;
            local_698 = 0;
            local_6a0 = 0;
            local_6b0 = 1;
            local_6b4 = 1;
            local_6b8 = 1;
            local_6c0 = 2;
            local_6e0 = (int *)0x0;
            local_70 = 1;
            local_a8 = 1;
            local_b8 = 1;
            local_f0 = 1;
            local_104 = 0x10;
            local_16d = 1;
            local_184 = 0x10;
            local_1ed = 1;
            local_660 = 0;
            local_678 = 0;
            local_730 = 0;
            local_720 = 0;
            local_718 = 0;
            local_708 = 0;
            local_704 = 0;
            local_700 = 0;
            local_6fc = 0;
            local_6f8 = 0;
            local_6f0 = 0;
            local_728 = 0;
            local_2f8 = local_450;
            local_2d8 = local_460;
            local_d8 = local_1c0;
            local_cc = local_1b4;
            local_c8 = local_1b0;
            local_b4 = local_194;
            local_90 = local_140;
            local_84 = local_134;
            local_80 = local_130;
            local_6c = local_114;
            local_710 = local_1c0;
            local_6e8 = local_c0;
            local_6d8 = local_1b0;
            local_6d0 = local_1b4;
            local_6c8 = local_1c0;
            local_6bc = local_194;
            local_680 = local_140;
            local_658.data = local_78;
            local_658.elemsize = local_130;
            local_658.elempack = local_134;
            local_658.allocator = local_140;
            local_658.w = local_114;
            gemm_transB_packed_tile_int8
                      (_max_jj,_k,in_stack_00000248,AT_tile.cstep._4_4_,(int)AT_tile.cstep,
                       AT_tile._60_4_,in_stack_000022d0,in_stack_000022d8,in_stack_000022e0);
            in_stack_fffffffffffff818 = &local_6e8;
            local_440 = in_stack_fffffffffffff818;
            local_318 = in_stack_fffffffffffff818;
            if (local_6e0 != (int *)0x0) {
              local_31c = 0xffffffff;
              LOCK();
              local_320 = *local_6e0;
              *local_6e0 = *local_6e0 + -1;
              UNLOCK();
              if (local_320 == 1) {
                if (local_6c8 == (long *)0x0) {
                  local_248 = local_6e8;
                  if (local_6e8 != (void *)0x0) {
                    free(local_6e8);
                  }
                }
                else {
                  (**(code **)(*local_6c8 + 0x18))(local_6c8,local_6e8);
                }
              }
            }
            *in_stack_fffffffffffff818 = (void *)0x0;
            in_stack_fffffffffffff818[2] = (void *)0x0;
            *(undefined4 *)(in_stack_fffffffffffff818 + 3) = 0;
            *(undefined4 *)(in_stack_fffffffffffff818 + 5) = 0;
            *(undefined4 *)((long)in_stack_fffffffffffff818 + 0x2c) = 0;
            *(undefined4 *)(in_stack_fffffffffffff818 + 6) = 0;
            *(undefined4 *)((long)in_stack_fffffffffffff818 + 0x34) = 0;
            *(undefined4 *)(in_stack_fffffffffffff818 + 7) = 0;
            in_stack_fffffffffffff818[8] = (void *)0x0;
            in_stack_fffffffffffff818[1] = (void *)0x0;
            in_stack_fffffffffffff810 = &local_658;
            local_430 = in_stack_fffffffffffff810;
            local_338 = in_stack_fffffffffffff810;
            if (local_658.refcount != (int *)0x0) {
              local_33c = 0xffffffff;
              LOCK();
              local_340 = *local_658.refcount;
              *local_658.refcount = *local_658.refcount + -1;
              UNLOCK();
              if (local_340 == 1) {
                if (local_658.allocator == (Allocator *)0x0) {
                  local_238 = local_658.data;
                  if (local_658.data != (void *)0x0) {
                    free(local_658.data);
                  }
                }
                else {
                  (*(local_658.allocator)->_vptr_Allocator[3])(local_658.allocator,local_658.data);
                }
              }
            }
            in_stack_fffffffffffff810->data = (void *)0x0;
            in_stack_fffffffffffff810->elemsize = 0;
            in_stack_fffffffffffff810->elempack = 0;
            in_stack_fffffffffffff810->dims = 0;
            in_stack_fffffffffffff810->w = 0;
            in_stack_fffffffffffff810->h = 0;
            in_stack_fffffffffffff810->d = 0;
            in_stack_fffffffffffff810->c = 0;
            in_stack_fffffffffffff810->cstep = 0;
            in_stack_fffffffffffff810->refcount = (int *)0x0;
          }
          unpack_output_tile_dequantize
                    (in_stack_fffffffffffff7e8,in_stack_fffffffffffff7e0,in_stack_fffffffffffff7d8,
                     in_stack_fffffffffffff7d4,in_stack_fffffffffffff7d0,in_stack_fffffffffffff7cc,
                     in_stack_fffffffffffff800,in_stack_fffffffffffff808,in_stack_fffffffffffff810,
                     in_stack_fffffffffffff7c8,in_stack_fffffffffffff7c4,
                     (int)in_stack_fffffffffffff818);
        }
        local_420 = &local_5f8;
        local_358 = local_420;
        if (local_5f0 != (int *)0x0) {
          local_35c = 0xffffffff;
          LOCK();
          local_360 = *local_5f0;
          *local_5f0 = *local_5f0 + -1;
          UNLOCK();
          if (local_360 == 1) {
            if (local_5d8 == (long *)0x0) {
              local_228 = local_5f8;
              if (local_5f8 != (void *)0x0) {
                free(local_5f8);
              }
            }
            else {
              (**(code **)(*local_5d8 + 0x18))(local_5d8,local_5f8);
            }
          }
        }
        local_5f8 = (void *)0x0;
        local_5e8 = 0;
        local_5e0 = 0;
        local_5d0 = 0;
        local_5cc = 0;
        local_5c8 = 0;
        local_5c4 = 0;
        local_5c0 = 0;
        local_5b8 = 0;
        local_5f0 = (int *)0x0;
      }
      local_464 = 0;
    }
    else {
      local_464 = -100;
    }
    local_510 = 1;
    ppvVar2 = &local_560;
    local_410 = ppvVar2;
    local_378 = ppvVar2;
    if (local_558 != (int *)0x0) {
      local_37c = 0xffffffff;
      LOCK();
      local_380 = *local_558;
      *local_558 = *local_558 + -1;
      UNLOCK();
      if (local_380 == 1) {
        if (local_540 == (long *)0x0) {
          local_218 = local_560;
          if (local_560 != (void *)0x0) {
            free(local_560);
          }
        }
        else {
          (**(code **)(*local_540 + 0x18))(local_540,local_560);
        }
      }
    }
    *ppvVar2 = (void *)0x0;
    ppvVar2[2] = (void *)0x0;
    *(undefined4 *)(ppvVar2 + 3) = 0;
    *(undefined4 *)(ppvVar2 + 5) = 0;
    *(undefined4 *)((long)ppvVar2 + 0x2c) = 0;
    *(undefined4 *)(ppvVar2 + 6) = 0;
    *(undefined4 *)((long)ppvVar2 + 0x34) = 0;
    *(undefined4 *)(ppvVar2 + 7) = 0;
    ppvVar2[8] = (void *)0x0;
    ppvVar2[1] = (void *)0x0;
  }
  else {
    local_464 = -100;
    local_510 = 1;
  }
  ppvVar2 = &local_500;
  if (local_4f8 != (int *)0x0) {
    local_39c = 0xffffffff;
    LOCK();
    local_3a0 = *local_4f8;
    *local_4f8 = *local_4f8 + -1;
    UNLOCK();
    if (local_3a0 == 1) {
      local_400 = ppvVar2;
      local_398 = ppvVar2;
      if (local_4e0 == (long *)0x0) {
        local_208 = local_500;
        if (local_500 != (void *)0x0) {
          free(local_500);
        }
      }
      else {
        (**(code **)(*local_4e0 + 0x18))(local_4e0,local_500);
      }
    }
  }
  *ppvVar2 = (void *)0x0;
  ppvVar2[2] = (void *)0x0;
  *(undefined4 *)(ppvVar2 + 3) = 0;
  *(undefined4 *)(ppvVar2 + 5) = 0;
  *(undefined4 *)((long)ppvVar2 + 0x2c) = 0;
  *(undefined4 *)(ppvVar2 + 6) = 0;
  *(undefined4 *)((long)ppvVar2 + 0x34) = 0;
  *(undefined4 *)(ppvVar2 + 7) = 0;
  ppvVar2[8] = (void *)0x0;
  ppvVar2[1] = (void *)0x0;
  return local_464;
}

Assistant:

static int gemm_AT_BT_x86_int8(const Mat& AT, const Mat& A_int8_scales, const Mat& BT, float B_int8_scale, const Mat& C, Mat& top_blob, int broadcast_type_C, int M, int N, int K, int output_transpose, float alpha, float beta, int constant_TILE_M, int constant_TILE_N, int constant_TILE_K, int nT, const Option& opt)
{
    // NCNN_LOGE("gemm_AT_BT_x86_int8");

    // NCNN_LOGE("M/N/K = %d %d %d", M, N, K);

    int TILE_M, TILE_N, TILE_K;
    get_optimal_tile_mnk_int8(M, N, K, constant_TILE_M, constant_TILE_N, constant_TILE_K, TILE_M, TILE_N, TILE_K, nT);

    // NCNN_LOGE("TILE M/N/K = %d %d %d", TILE_M, TILE_N, TILE_K);

    int nn_M = (M + TILE_M - 1) / TILE_M;
    // int nn_N = (N + TILE_N - 1) / TILE_N;

    // const float output_descale = 1.f / (A_int8_scale * B_int8_scale);
    Mat output_descales(M, 4u, opt.workspace_allocator);
    if (output_descales.empty())
        return -100;

    for (int i = 0; i < M; i++)
    {
        output_descales[i] = 1.f / (A_int8_scales[i] * B_int8_scale);
    }

    Mat topT(TILE_N * TILE_M, 1, nT, 4u, opt.workspace_allocator);
    if (topT.empty())
        return -100;

    const struct gemm_x86_int8_omp_args args = {TILE_M, TILE_N, TILE_K, broadcast_type_C, 0, output_transpose, alpha, beta};

    #pragma omp parallel for num_threads(nT)
    for (int ppi = 0; ppi < nn_M; ppi++)
    {
        // shadowed variable for less openmp task args
        const int TILE_M = args.TILE_M;
        const int TILE_N = args.TILE_N;
        const int TILE_K = args.TILE_K;
        const int broadcast_type_C = args.broadcast_type_C;
        const int output_transpose = args.output_transpose;
        const float alpha = args.alpha;
        const float beta = args.beta;
        // const int output_elemtype = args.output_elemtype;

        const int i = ppi * TILE_M;

        const int max_ii = std::min((M - i), TILE_M);

        Mat topT_tile = topT.channel(get_omp_thread_num());

        for (int j = 0; j < N; j += TILE_N)
        {
            const int max_jj = std::min((N - j), TILE_N);

            for (int k = 0; k < K; k += TILE_K)
            {
                const int max_kk = std::min((K - k), TILE_K);

                // NCNN_LOGE("max_ii/jj/kk = %d %d %d", max_ii, max_jj, max_kk);

                Mat AT_tile = AT.channel(i / TILE_M).row_range(k / TILE_K, 1);

                Mat BT_tile = BT.channel(j / TILE_N).row_range(k / TILE_K, 1);

                gemm_transB_packed_tile_int8(AT_tile, BT_tile, topT_tile, i, max_ii, j, max_jj, k, max_kk);
            }

            unpack_output_tile_dequantize(topT_tile, C, top_blob, broadcast_type_C, i, max_ii, j, max_jj, output_descales, alpha, beta, output_transpose);
        }
    }

    return 0;
}